

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O2

void __thiscall TPZAcademicGeoMesh::DeformGMesh(TPZAcademicGeoMesh *this,TPZGeoMesh *gmesh)

{
  TPZGeoNode *pTVar1;
  TPZGeoEl **ppTVar2;
  int i;
  long lVar3;
  long lVar4;
  long nelem;
  TPZManVector<double,_3> xbefore;
  TPZManVector<double,_3> xafter;
  
  lVar4 = (gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
  TPZManVector<double,_3>::TPZManVector(&xbefore,3);
  TPZManVector<double,_3>::TPZManVector(&xafter,3);
  nelem = 0;
  if (lVar4 < 1) {
    lVar4 = nelem;
  }
  for (; nelem != lVar4; nelem = nelem + 1) {
    pTVar1 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,nelem);
    TPZGeoNode::GetCoordinates(pTVar1,&xbefore.super_TPZVec<double>);
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      xbefore.super_TPZVec<double>.fStore[lVar3] =
           xbefore.super_TPZVec<double>.fStore[lVar3] + xbefore.super_TPZVec<double>.fStore[lVar3] +
           -1.0;
    }
    ppTVar2 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (&(this->fDeformed).fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>,0);
    (**(code **)(*(long *)*ppTVar2 + 0x228))(*ppTVar2,&xbefore,&xafter);
    pTVar1 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,nelem);
    TPZGeoNode::SetCoord(pTVar1,&xafter.super_TPZVec<double>);
  }
  TPZManVector<double,_3>::~TPZManVector(&xafter);
  TPZManVector<double,_3>::~TPZManVector(&xbefore);
  return;
}

Assistant:

void TPZAcademicGeoMesh::DeformGMesh(TPZGeoMesh &gmesh)
{
    int64_t nnodes = gmesh.NodeVec().NElements();
    TPZManVector<REAL,3> xbefore(3),xafter(3);
    for (int64_t nod=0; nod<nnodes; nod++) {
        gmesh.NodeVec()[nod].GetCoordinates(xbefore);
        for (int i=0; i<3; i++) {
            xbefore[i] = 2.*xbefore[i]-1.;
        }
        fDeformed.ElementVec()[0]->X(xbefore, xafter);
        gmesh.NodeVec()[nod].SetCoord(xafter);
    }
}